

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O0

void event_remove_all_handlers(void)

{
  event_handler_entry *peVar1;
  event_handler_entry *next;
  event_handler_entry *handler;
  wchar_t type;
  
  for (handler._4_4_ = 0; handler._4_4_ < 0x42; handler._4_4_ = handler._4_4_ + 1) {
    next = event_handlers[handler._4_4_];
    while (next != (event_handler_entry *)0x0) {
      peVar1 = next->next;
      mem_free(next);
      next = peVar1;
    }
    event_handlers[handler._4_4_] = (event_handler_entry *)0x0;
  }
  return;
}

Assistant:

void event_remove_all_handlers(void)
{
	int type;
	struct event_handler_entry *handler, *next;

	for (type = 0; type < N_GAME_EVENTS; type++) {
		handler = event_handlers[type];
		while (handler) {
			next = handler->next;
			mem_free(handler);
			handler = next;
		}
		event_handlers[type] = NULL;
	}
}